

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QRhiVertexInputLayout *v)

{
  QTextStream *this;
  qsizetype qVar1;
  QDebug this_00;
  QVarLengthArray<QRhiVertexInputBinding,_8LL> *in_RDX;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QDebugStateSaver saver;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  undefined1 *local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)v);
  this = (QTextStream *)(v->m_bindings).super_QVLABase<QRhiVertexInputBinding>.super_QVLABaseBase.a;
  this[0x30] = (QTextStream)0x0;
  QVar2.m_data = (storage_type *)0x1f;
  QVar2.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar2);
  QTextStream::operator<<(this,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  local_48[0] = (QArrayData *)
                (v->m_bindings).super_QVLABase<QRhiVertexInputBinding>.super_QVLABaseBase.a;
  if ((char)local_48[0][3].ref_._q_value.super___atomic_base<int>._M_i == '\x01') {
    QTextStream::operator<<((QTextStream *)local_48[0],' ');
    local_48[0] = (QArrayData *)
                  (v->m_bindings).super_QVLABase<QRhiVertexInputBinding>.super_QVLABaseBase.a;
  }
  *(int *)&local_48[0][2].alloc = (int)local_48[0][2].alloc + 1;
  local_70.stream = (Stream *)0x0;
  QtPrivate::printSequentialContainer<QVarLengthArray<QRhiVertexInputBinding,8ll>>
            ((QtPrivate *)&local_68,(Stream *)local_48,"QVarLengthArray",in_RDX);
  QDebug::~QDebug((QDebug *)local_48);
  this_00.stream = local_68.stream;
  QVar3.m_data = &DAT_0000000c;
  QVar3.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar3);
  QTextStream::operator<<(&(this_00.stream)->ts,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if ((local_68.stream)->space == true) {
    QTextStream::operator<<(&(local_68.stream)->ts,' ');
  }
  (local_68.stream)->ref = (local_68.stream)->ref + 1;
  local_60.stream = (Stream *)0x0;
  QtPrivate::printSequentialContainer<QVarLengthArray<QRhiVertexInputAttribute,8ll>>
            ((QtPrivate *)&local_58,(Stream *)local_48,"QVarLengthArray",
             (QVarLengthArray<QRhiVertexInputAttribute,_8LL> *)(in_RDX + 1));
  QDebug::~QDebug((QDebug *)local_48);
  QTextStream::operator<<(&(local_58.stream)->ts,')');
  if ((local_58.stream)->space == true) {
    QTextStream::operator<<(&(local_58.stream)->ts,' ');
  }
  QDebug::~QDebug(&local_58);
  QDebug::~QDebug(&local_60);
  QDebug::~QDebug(&local_68);
  QDebug::~QDebug(&local_70);
  qVar1 = (v->m_bindings).super_QVLABase<QRhiVertexInputBinding>.super_QVLABaseBase.a;
  (v->m_bindings).super_QVLABase<QRhiVertexInputBinding>.super_QVLABaseBase.a = 0;
  *(qsizetype *)dbg.stream = qVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiVertexInputLayout &v)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiVertexInputLayout(bindings=" << v.m_bindings
                  << " attributes=" << v.m_attributes
                  << ')';
    return dbg;
}